

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O1

void __thiscall
TCLAP::StdOutput::spacePrint
          (StdOutput *this,ostream *os,string *s,int maxWidth,int indentSpaces,int secondLineOffset)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long *local_68;
  long local_60;
  long local_58 [2];
  size_type local_48;
  ostream *local_40;
  ulong local_38;
  
  uVar5 = (ulong)(uint)indentSpaces;
  local_48 = s->_M_string_length;
  uVar9 = (uint)local_48;
  if (maxWidth < 1 || (int)(uVar9 + indentSpaces) <= maxWidth) {
    if (0 < indentSpaces) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        uVar9 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar9;
      } while (uVar9 != 0);
    }
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(s->_M_dataplus)._M_p,s->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    return;
  }
  if (0 < (int)uVar9) {
    uVar6 = maxWidth - indentSpaces;
    iVar11 = 0;
    local_40 = os;
    do {
      poVar4 = local_40;
      uVar12 = (int)local_48 - iVar11;
      uVar13 = uVar12;
      if ((int)uVar6 < (int)uVar12) {
        uVar13 = uVar6;
      }
      if (((int)uVar6 <= (int)uVar12) && (-1 < (int)uVar13)) {
        lVar10 = (long)(int)uVar6 + 1;
        uVar13 = uVar6;
        do {
          cVar1 = (s->_M_dataplus)._M_p[lVar10 + (long)iVar11 + -1];
          if (((cVar1 == ' ') || (cVar1 == ',')) || (cVar1 == '|')) goto LAB_0010f6a7;
          uVar13 = uVar13 - 1;
          lVar3 = lVar10 + -1;
          bVar2 = 0 < lVar10;
          lVar10 = lVar3;
        } while (lVar3 != 0 && bVar2);
        uVar13 = 0xffffffff;
      }
LAB_0010f6a7:
      if ((int)uVar13 < 1) {
        uVar13 = uVar6;
      }
      uVar14 = (ulong)uVar13;
      if (0 < (int)uVar13) {
        uVar7 = 0;
        do {
          lVar10 = uVar7 + (long)iVar11;
          uVar7 = uVar7 + 1;
          if ((s->_M_dataplus)._M_p[lVar10] == '\n') {
            uVar14 = uVar7 & 0xffffffff;
          }
          uVar13 = (uint)uVar14;
        } while ((long)uVar7 < (long)(int)uVar13);
      }
      local_38 = uVar5;
      if (0 < (int)uVar5) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          uVar12 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar12;
        } while (uVar12 != 0);
      }
      lVar10 = (long)iVar11;
      iVar8 = 0;
      if (iVar11 == 0) {
        iVar8 = secondLineOffset;
      }
      std::__cxx11::string::substr((ulong)&local_68,(ulong)s);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_68,local_60);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      uVar6 = uVar6 - iVar8;
      uVar5 = (ulong)(uint)((int)local_38 + iVar8);
      iVar11 = iVar11 + uVar13 + -1;
      do {
        iVar11 = iVar11 + 1;
        if ((long)(ulong)(uVar9 & 0x7fffffff) <= lVar10) break;
        lVar3 = lVar10 + (int)uVar13;
        lVar10 = lVar10 + 1;
      } while ((s->_M_dataplus)._M_p[lVar3] == ' ');
    } while (iVar11 < (int)local_48);
  }
  return;
}

Assistant:

inline void StdOutput::spacePrint( std::ostream& os, 
						           const std::string& s, 
						           int maxWidth, 
						           int indentSpaces, 
						           int secondLineOffset ) const
{
	int len = static_cast<int>(s.length());

	if ( (len + indentSpaces > maxWidth) && maxWidth > 0 )
		{
			int allowedLen = maxWidth - indentSpaces;
			int start = 0;
			while ( start < len )
				{
					// find the substring length
					// int stringLen = std::min<int>( len - start, allowedLen );
					// doing it this way to support a VisualC++ 2005 bug 
					using namespace std; 
					int stringLen = min<int>( len - start, allowedLen );

					// trim the length so it doesn't end in middle of a word
					if ( stringLen == allowedLen )
						while ( stringLen >= 0 &&
								s[stringLen+start] != ' ' && 
								s[stringLen+start] != ',' &&
								s[stringLen+start] != '|' ) 
							stringLen--;
	
					// ok, the word is longer than the line, so just split 
					// wherever the line ends
					if ( stringLen <= 0 )
						stringLen = allowedLen;

					// check for newlines
					for ( int i = 0; i < stringLen; i++ )
						if ( s[start+i] == '\n' )
							stringLen = i+1;

					// print the indent	
					for ( int i = 0; i < indentSpaces; i++ )
						os << " ";

					if ( start == 0 )
						{
							// handle second line offsets
							indentSpaces += secondLineOffset;

							// adjust allowed len
							allowedLen -= secondLineOffset;
						}

					os << s.substr(start,stringLen) << std::endl;

					// so we don't start a line with a space
					while ( s[stringLen+start] == ' ' && start < len )
						start++;
			
					start += stringLen;
				}
		}
	else
		{
			for ( int i = 0; i < indentSpaces; i++ )
				os << " ";
			os << s << std::endl;
		}
}